

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O0

void get_4d_sad_from_mm256_epi32(__m256i *v,uint32_t *res)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  __m128i sad;
  __m256i mask;
  __m256i u3;
  __m256i u2;
  __m256i u1;
  __m256i u0;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar1 = vpunpcklqdq_avx(ZEXT816(0xffffffff),ZEXT816(0xffffffff));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0xffffffff),ZEXT816(0xffffffff));
  uStack_70 = auVar2._0_8_;
  uStack_68 = auVar2._8_8_;
  auVar7 = vpsrldq_avx2(*in_RDI,4);
  auVar8 = vpsrldq_avx2(in_RDI[1],4);
  auVar9 = vpsrldq_avx2(in_RDI[2],4);
  auVar10 = vpsrldq_avx2(in_RDI[3],4);
  auVar7 = vpaddd_avx2(auVar7,*in_RDI);
  auVar8 = vpaddd_avx2(auVar8,in_RDI[1]);
  auVar9 = vpaddd_avx2(auVar9,in_RDI[2]);
  auVar10 = vpaddd_avx2(auVar10,in_RDI[3]);
  auVar6._16_8_ = uStack_70;
  auVar6._0_16_ = auVar1;
  auVar6._24_8_ = uStack_68;
  auVar7 = vpand_avx2(auVar7,auVar6);
  auVar5._16_8_ = uStack_70;
  auVar5._0_16_ = auVar1;
  auVar5._24_8_ = uStack_68;
  auVar8 = vpand_avx2(auVar8,auVar5);
  auVar4._16_8_ = uStack_70;
  auVar4._0_16_ = auVar1;
  auVar4._24_8_ = uStack_68;
  auVar9 = vpand_avx2(auVar9,auVar4);
  auVar3._16_8_ = uStack_70;
  auVar3._0_16_ = auVar1;
  auVar3._24_8_ = uStack_68;
  auVar10 = vpand_avx2(auVar10,auVar3);
  auVar8 = vpslldq_avx2(auVar8,4);
  auVar10 = vpslldq_avx2(auVar10,4);
  auVar7 = vpor_avx2(auVar7,auVar8);
  auVar8 = vpor_avx2(auVar9,auVar10);
  auVar9 = vpunpcklqdq_avx2(auVar7,auVar8);
  auVar7 = vpunpckhqdq_avx2(auVar7,auVar8);
  auVar7 = vpaddd_avx2(auVar9,auVar7);
  auVar1 = vpaddd_avx(auVar7._16_16_,auVar7._0_16_);
  local_510 = auVar1._0_8_;
  uStack_508 = auVar1._8_8_;
  *in_RSI = local_510;
  in_RSI[1] = uStack_508;
  return;
}

Assistant:

static inline void get_4d_sad_from_mm256_epi32(const __m256i *v,
                                               uint32_t *res) {
  __m256i u0, u1, u2, u3;
  const __m256i mask = _mm256_set1_epi64x(~0u);
  __m128i sad;

  // 8 32-bit summation
  u0 = _mm256_srli_si256(v[0], 4);
  u1 = _mm256_srli_si256(v[1], 4);
  u2 = _mm256_srli_si256(v[2], 4);
  u3 = _mm256_srli_si256(v[3], 4);

  u0 = _mm256_add_epi32(u0, v[0]);
  u1 = _mm256_add_epi32(u1, v[1]);
  u2 = _mm256_add_epi32(u2, v[2]);
  u3 = _mm256_add_epi32(u3, v[3]);

  u0 = _mm256_and_si256(u0, mask);
  u1 = _mm256_and_si256(u1, mask);
  u2 = _mm256_and_si256(u2, mask);
  u3 = _mm256_and_si256(u3, mask);
  // 4 32-bit summation, evenly positioned

  u1 = _mm256_slli_si256(u1, 4);
  u3 = _mm256_slli_si256(u3, 4);

  u0 = _mm256_or_si256(u0, u1);
  u2 = _mm256_or_si256(u2, u3);
  // 8 32-bit summation, interleaved

  u1 = _mm256_unpacklo_epi64(u0, u2);
  u3 = _mm256_unpackhi_epi64(u0, u2);

  u0 = _mm256_add_epi32(u1, u3);
  sad = _mm_add_epi32(_mm256_extractf128_si256(u0, 1),
                      _mm256_castsi256_si128(u0));
  _mm_storeu_si128((__m128i *)res, sad);
}